

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

bool __thiscall wasm::String::convertWTF8ToWTF16(String *this,ostream *os,string_view str)

{
  optional<unsigned_int> oVar1;
  bool bVar2;
  bool bVar3;
  _Storage<unsigned_int,_true> u;
  bool bVar4;
  undefined1 local_40 [8];
  string_view str_local;
  
  str_local._M_len = str._M_len;
  if (os == (ostream *)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = true;
    bVar4 = false;
    local_40 = (undefined1  [8])os;
    do {
      oVar1 = anon_unknown_0::takeWTF8CodePoint((string_view *)local_40);
      u._M_value = oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_payload;
      if (((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
        u._M_value = 0xfffd;
      }
      bVar2 = bVar3;
      if ((u._M_value & 0xfffffc00) == 0xdc00) {
        bVar2 = false;
      }
      if (!bVar4) {
        bVar2 = bVar3;
      }
      bVar3 = bVar2;
      if (((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
        bVar3 = false;
      }
      bVar4 = (u._M_value & 0xfffffc00) == 0xd800;
      writeWTF16CodePoint((ostream *)this,u._M_value);
    } while (local_40 != (undefined1  [8])0x0);
  }
  return bVar3;
}

Assistant:

bool convertWTF8ToWTF16(std::ostream& os, std::string_view str) {
  bool valid = true;
  bool lastWasLeadingSurrogate = false;

  while (str.size()) {
    auto u = takeWTF8CodePoint(str);
    if (!u) {
      valid = false;
      u = replacementCharacter;
    }

    bool isLeadingSurrogate = 0xD800 <= *u && *u < 0xDC00;
    bool isTrailingSurrogate = 0xDC00 <= *u && *u < 0xE000;
    if (lastWasLeadingSurrogate && isTrailingSurrogate) {
      // Invalid surrogate sequence.
      valid = false;
    }
    lastWasLeadingSurrogate = isLeadingSurrogate;

    writeWTF16CodePoint(os, *u);
  }

  return valid;
}